

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_lzma_varint(uchar *compressed,size_t compressed_size,size_t *poffset,uint64_t *val)

{
  byte *pbVar1;
  ulong uStack_48;
  uchar b;
  uint64_t v;
  size_t sStack_38;
  int i;
  size_t off;
  uint64_t *val_local;
  size_t *poffset_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  
  sStack_38 = *poffset;
  v._4_4_ = 0;
  uStack_48 = 0;
  while( true ) {
    if (compressed_size <= sStack_38) {
      elf_uncompress_failed();
      return 0;
    }
    pbVar1 = compressed + sStack_38;
    uStack_48 = (long)(int)((*pbVar1 & 0x7f) << ((char)v._4_4_ * '\a' & 0x1fU)) | uStack_48;
    sStack_38 = sStack_38 + 1;
    if ((*pbVar1 & 0x80) == 0) break;
    v._4_4_ = v._4_4_ + 1;
    if (8 < v._4_4_) {
      elf_uncompress_failed();
      return 0;
    }
  }
  *poffset = sStack_38;
  *val = uStack_48;
  return 1;
}

Assistant:

static int
elf_lzma_varint (const unsigned char *compressed, size_t compressed_size,
		 size_t *poffset, uint64_t *val)
{
  size_t off;
  int i;
  uint64_t v;
  unsigned char b;

  off = *poffset;
  i = 0;
  v = 0;
  while (1)
    {
      if (unlikely (off >= compressed_size))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
      b = compressed[off];
      v |= (b & 0x7f) << (i * 7);
      ++off;
      if ((b & 0x80) == 0)
	{
	  *poffset = off;
	  *val = v;
	  return 1;
	}
      ++i;
      if (unlikely (i >= 9))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
    }
}